

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.h
# Opt level: O2

void __thiscall Server<Client>::start(Server<Client> *this)

{
  Client cl;
  packaged_task<void_()> task;
  Client local_54;
  anon_class_16_2_37edc3c6_for__M_fn local_50;
  packaged_task<void()> local_40 [16];
  
  LOCK();
  (this->is_working)._M_base._M_i = true;
  UNLOCK();
  while (((this->is_working)._M_base._M_i & 1U) != 0) {
    (**this->acceptor->_vptr_IAcceptor)(&local_54);
    local_50.this = this;
    Client::Client(&local_50.client,&local_54);
    std::packaged_task<void()>::packaged_task<Server<Client>::start()::_lambda()_1_,void>
              (local_40,&local_50);
    Client::~Client(&local_50.client);
    NotLockFreeQueue<std::packaged_task<void_()>_>::push_and_wait
              (&(this->thread_pool).queue,(packaged_task<void_()> *)local_40);
    std::packaged_task<void_()>::~packaged_task((packaged_task<void_()> *)local_40);
    Client::~Client(&local_54);
  }
  return;
}

Assistant:

void Server<T>::start() {
    is_working = true;
    while(is_working) {
        try {
            T cl(acceptor.accept());
            std::packaged_task<void(void)> task(
                [this, client = std::move(cl)] () mutable {
                    handler.handle(std::move(client));
                }
            );
            thread_pool.push(std::move(task));
        } catch (AcceptException& ex) {
            stream << ex.what() << std::endl;
        }
    }
}